

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  stbtt__edge *psVar1;
  stbtt_uint8 sVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  short sVar6;
  ImFont *pIVar7;
  stbtt_uint8 *data;
  ImWchar *pIVar8;
  uchar *puVar9;
  long lVar10;
  bool bVar11;
  stbrp_node *psVar12;
  undefined1 auVar13 [16];
  ushort *puVar14;
  undefined8 uVar15;
  ushort uVar16;
  short sVar17;
  stbtt_uint32 sVar18;
  uint uVar24;
  int iVar25;
  uint uVar26;
  stbtt__active_edge *z;
  long lVar27;
  stbtt_uint32 sVar19;
  stbtt_uint32 sVar20;
  stbtt_uint32 sVar21;
  stbtt_uint32 sVar22;
  stbtt_uint32 sVar23;
  stbrp_context *ptr;
  stbrp_node *ptr_00;
  ImFontConfig *pIVar28;
  undefined4 extraout_var;
  void *pvVar29;
  void *__s;
  void *__s_00;
  uchar *puVar30;
  stbtt__point *points;
  ulong uVar31;
  stbtt__edge *psVar32;
  stbtt__buf *scanline;
  undefined8 *puVar33;
  stbtt__buf *psVar34;
  ulong uVar35;
  stbtt__buf *psVar36;
  stbtt__buf *psVar37;
  long lVar38;
  float *pfVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  int iVar43;
  stbtt_fontinfo *psVar44;
  uchar uVar45;
  ImWchar IVar46;
  uint uVar47;
  undefined8 *puVar48;
  ulong uVar49;
  int iVar50;
  ImWchar **ppIVar51;
  size_t sVar52;
  byte *pbVar53;
  int iVar54;
  int iVar55;
  void *p;
  size_t size;
  short *psVar56;
  stbtt__buf *psVar57;
  stbtt__active_edge *e;
  byte *pbVar58;
  long lVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  float in_XMM2_Da;
  float fVar67;
  float fVar68;
  float fVar69;
  float in_XMM3_Da;
  float fVar70;
  float fVar71;
  float fVar72;
  stbtt__buf sVar73;
  stbtt_uint32 charstrings;
  float y0_2;
  int x0_1;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 cstype;
  int y0;
  stbtt_pack_context spc;
  int y0_1;
  int x1_1;
  stbtt__buf b;
  undefined4 in_stack_fffffffffffffb74;
  ImFontAtlas *pIVar74;
  uint local_470;
  stbtt__buf in_stack_fffffffffffffb98;
  undefined1 auVar75 [12];
  stbtt_uint32 local_44c;
  ulong local_448;
  float local_43c;
  undefined1 local_438 [16];
  void *local_420;
  stbtt_uint32 local_418;
  stbtt_uint32 local_414;
  stbtt__point *local_410;
  void *local_408;
  stbtt_fontinfo *local_400;
  undefined8 local_3f8;
  stbtt_uint32 local_3ec;
  undefined1 local_3e8 [16];
  ulong local_3d8;
  ulong local_3d0;
  stbtt__buf local_3c8;
  stbtt_pack_context local_3b8;
  long local_378;
  undefined8 *local_370;
  float *local_368;
  stbtt__edge *local_360;
  float local_354;
  float local_350;
  uint local_34c;
  undefined1 local_348 [16];
  ulong local_330;
  long local_328;
  undefined4 local_320;
  uint local_31c;
  uint local_318;
  float local_314;
  float local_310;
  uint local_30c;
  uint local_308;
  int local_304;
  void *local_300;
  void *local_2f8;
  void *local_2f0;
  long local_2e8;
  long local_2e0;
  uchar *local_2d8;
  float *local_2d0;
  float local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  long local_2b0;
  ImFontConfig *local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  short *local_278;
  long local_270;
  long local_268;
  long local_260;
  size_t local_258;
  size_t local_250;
  ulong local_248;
  int local_240;
  int local_23c;
  stbtt__buf local_238 [32];
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x69d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  uVar35 = 0;
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  lVar27 = (long)(atlas->ConfigData).Size;
  local_3d0 = 0;
  if (0 < lVar27) {
    pIVar28 = (atlas->ConfigData).Data;
    lVar38 = 0;
    local_3d0 = 0;
    uVar35 = 0;
    do {
      ppIVar51 = &pIVar28[lVar38].GlyphRanges;
      if (*ppIVar51 == (ImWchar *)0x0) {
        *ppIVar51 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      uVar16 = **ppIVar51;
      puVar14 = *ppIVar51;
      while (uVar16 != 0) {
        if (puVar14[1] == 0) break;
        local_3d0 = (ulong)(((int)local_3d0 - (uint)uVar16) + (uint)puVar14[1] + 1);
        uVar35 = (ulong)((int)uVar35 + 1);
        uVar16 = puVar14[2];
        puVar14 = puVar14 + 2;
      }
      lVar38 = lVar38 + 1;
    } while (lVar38 != lVar27);
  }
  iVar43 = atlas->TexDesiredWidth;
  if (iVar43 < 1) {
    iVar43 = 0x1000;
    iVar25 = (int)local_3d0;
    if ((iVar25 < 0xfa1) && (iVar43 = 0x800, iVar25 < 0x7d1)) {
      iVar43 = (uint)(1000 < iVar25) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar43;
  atlas->TexHeight = 0;
  local_3b8.h_oversample = 0;
  local_3b8.v_oversample = 0;
  local_3b8.pixels = (uchar *)0x0;
  local_3b8.width = 0;
  local_3b8.height = 0;
  local_3b8.stride_in_bytes = 0;
  local_3b8.padding = 0;
  local_3b8.user_allocator_context = (void *)0x0;
  local_3b8.pack_info = (stbrp_context *)0x0;
  local_3b8.nodes = (stbrp_node *)0x0;
  iVar25 = atlas->TexGlyphPadding;
  local_3d8 = uVar35;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar55 = iVar43 - iVar25;
  ptr_00 = (stbrp_node *)ImGui::MemAlloc((long)iVar55 << 4);
  if (ptr_00 == (stbrp_node *)0x0 || ptr == (stbrp_context *)0x0) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (ptr_00 != (stbrp_node *)0x0) {
      ImGui::MemFree(ptr_00);
    }
  }
  else {
    local_3b8.user_allocator_context = (void *)0x0;
    local_3b8.height = 0x8000;
    local_3b8.width = iVar43;
    local_3b8.pixels = (uchar *)0x0;
    local_3b8.padding = iVar25;
    local_3b8.stride_in_bytes = iVar43;
    local_3b8.h_oversample = 1;
    local_3b8.v_oversample = 1;
    local_3b8.pack_info = ptr;
    local_3b8.nodes = ptr_00;
    if ((iVar25 < -0x7fff) || (0xffff < iVar55)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_rect_pack.h"
                    ,0x100,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    if (iVar55 < 2) {
      uVar35 = 0;
    }
    else {
      uVar35 = 0;
      psVar12 = ptr_00;
      do {
        uVar35 = uVar35 + 1;
        psVar12->next = psVar12 + 1;
        psVar12 = psVar12 + 1;
      } while (iVar55 - 1 != uVar35);
      uVar35 = uVar35 & 0xffffffff;
    }
    ptr_00[uVar35].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = ptr_00;
    ptr->active_head = ptr->extra;
    ptr->width = iVar55;
    ptr->height = 0x8000 - iVar25;
    ptr->num_nodes = iVar55;
    ptr->align = (iVar55 * 2 + -1) / iVar55;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar55;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  if (ptr_00 == (stbrp_node *)0x0 || ptr == (stbrp_context *)0x0) {
LAB_001af3d7:
    local_320 = 0;
  }
  else {
    local_3b8.h_oversample = 1;
    local_3b8.v_oversample = 1;
    ImFontAtlasBuildPackCustomRects(atlas,local_3b8.pack_info);
    local_408 = ImGui::MemAlloc((long)(atlas->ConfigData).Size * 0xc0);
    iVar43 = (atlas->ConfigData).Size;
    local_320 = (undefined4)CONCAT71((int7)((ulong)local_408 >> 8),iVar43 < 1);
    if (0 < iVar43) {
      lVar27 = 0;
      do {
        pvVar29 = local_408;
        auVar75 = in_stack_fffffffffffffb98._4_12_;
        pIVar28 = (atlas->ConfigData).Data;
        pIVar7 = pIVar28[lVar27].DstFont;
        if ((pIVar7 == (ImFont *)0x0) ||
           (pIVar74 = pIVar7->ContainerAtlas, pIVar74 != atlas && pIVar74 != (ImFontAtlas *)0x0)) {
          __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0x6d0,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        pIVar28 = pIVar28 + lVar27;
        data = (stbtt_uint8 *)pIVar28->FontData;
        iVar43 = pIVar28->FontNo;
        sVar2 = *data;
        if (((((sVar2 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
           (((sVar2 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_001aca68:
          sVar23 = -(uint)(iVar43 != 0);
        }
        else {
          if (sVar2 == '\0') {
            if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_001aca41;
            goto LAB_001aca68;
          }
          if ((((sVar2 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
          goto LAB_001aca68;
LAB_001aca41:
          sVar23 = 0xffffffff;
          if (sVar2 == 't') {
            if (data[1] == 't') {
              if ((data[2] == 'c') && (data[3] == 'f')) {
                uVar24 = *(uint *)(data + 4);
                uVar24 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                         uVar24 << 0x18;
                if (((uVar24 == 0x20000) || (uVar24 == 0x10000)) &&
                   (uVar24 = *(uint *)(data + 8),
                   iVar43 < (int)(uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8
                                 | uVar24 << 0x18))) {
                  uVar24 = *(uint *)(data + (long)iVar43 * 4 + 0xc);
                  sVar23 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                           uVar24 << 0x18;
                }
              }
            }
            else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_001aca68;
          }
        }
        if ((int)sVar23 < 0) {
          __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0x6d3,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        *(stbtt_uint8 **)((long)local_408 + lVar27 * 0xc0 + 8) = data;
        *(stbtt_uint32 *)((long)local_408 + lVar27 * 0xc0 + 0x10) = sVar23;
        *(undefined8 *)((long)local_408 + lVar27 * 0xc0 + 0x40) = 0;
        *(undefined8 *)((long)local_408 + lVar27 * 0xc0 + 0x48) = 0;
        sVar18 = stbtt__find_table(data,sVar23,"cmap");
        auVar13 = local_438;
        local_438._4_4_ = extraout_var;
        local_438._0_4_ = sVar18;
        local_438._8_8_ = auVar13._8_8_;
        sVar18 = stbtt__find_table(data,sVar23,"loca");
        local_3e8._0_4_ = sVar18;
        *(stbtt_uint32 *)((long)pvVar29 + lVar27 * 0xc0 + 0x18) = sVar18;
        sVar18 = stbtt__find_table(data,sVar23,"head");
        *(stbtt_uint32 *)((long)pvVar29 + lVar27 * 0xc0 + 0x1c) = sVar18;
        sVar19 = stbtt__find_table(data,sVar23,"glyf");
        *(stbtt_uint32 *)((long)pvVar29 + lVar27 * 0xc0 + 0x20) = sVar19;
        sVar20 = stbtt__find_table(data,sVar23,"hhea");
        *(stbtt_uint32 *)((long)pvVar29 + lVar27 * 0xc0 + 0x24) = sVar20;
        sVar21 = stbtt__find_table(data,sVar23,"hmtx");
        *(stbtt_uint32 *)((long)pvVar29 + lVar27 * 0xc0 + 0x28) = sVar21;
        sVar22 = stbtt__find_table(data,sVar23,"kern");
        auVar13 = local_438;
        *(stbtt_uint32 *)((long)pvVar29 + lVar27 * 0xc0 + 0x2c) = sVar22;
        in_stack_fffffffffffffb98._4_12_ = auVar75;
        in_stack_fffffffffffffb98.data._0_4_ = (float)sVar23;
        uVar15 = local_438._0_8_;
        sVar23 = stbtt__find_table(data,sVar23,"GPOS");
        *(stbtt_uint32 *)((long)pvVar29 + lVar27 * 0xc0 + 0x30) = sVar23;
        iVar43 = auVar13._0_4_;
        if ((((iVar43 == 0) || (sVar18 == 0)) || (sVar20 == 0)) || (sVar21 == 0)) {
LAB_001af3c2:
          atlas->TexWidth = 0;
          atlas->TexHeight = 0;
          ImGui::MemFree(local_408);
          goto LAB_001af3d7;
        }
        if (sVar19 == 0) {
          local_3f8._0_4_ = 2;
          local_44c = 0;
          local_414 = 0;
          local_418 = 0;
          sVar23 = stbtt__find_table(data,(stbtt_uint32)in_stack_fffffffffffffb98.data,"CFF ");
          if (sVar23 != 0) {
            *(undefined8 *)((long)pvVar29 + lVar27 * 0xc0 + 0x90) = 0;
            *(undefined8 *)((long)pvVar29 + lVar27 * 0xc0 + 0x98) = 0;
            *(undefined8 *)((long)pvVar29 + lVar27 * 0xc0 + 0x80) = 0;
            *(undefined8 *)((long)pvVar29 + lVar27 * 0xc0 + 0x88) = 0;
            *(stbtt_uint8 **)((long)pvVar29 + lVar27 * 0xc0 + 0x40) = data + sVar23;
            *(undefined8 *)((long)pvVar29 + lVar27 * 0xc0 + 0x48) = 0x2000000000000000;
            local_238[0].data = *(uchar **)((long)pvVar29 + lVar27 * 0xc0 + 0x40);
            local_238[0]._8_8_ = *(undefined8 *)((long)pvVar29 + lVar27 * 0xc0 + 0x48);
            if ((long)local_238[0].cursor < -2) goto LAB_001af540;
            lVar38 = (long)local_238[0].cursor + 2;
            iVar25 = (int)lVar38;
            if (local_238[0].size < iVar25) goto LAB_001af540;
            uVar24 = 0;
            if (iVar25 < local_238[0].size) {
              iVar25 = local_238[0].cursor + 3;
              uVar24 = (uint)local_238[0].data[lVar38];
            }
            local_238[0].cursor = iVar25;
            if (local_238[0].size < (int)uVar24) goto LAB_001af540;
            local_238[0].cursor = uVar24;
            stbtt__cff_get_index(local_238);
            sVar73 = stbtt__cff_get_index(local_238);
            local_3c8 = stbtt__cff_index_get(sVar73,0);
            stbtt__cff_get_index(local_238);
            sVar73 = stbtt__cff_get_index(local_238);
            *(stbtt__buf *)((long)pvVar29 + lVar27 * 0xc0 + 0x60) = sVar73;
            stbtt__dict_get_ints(&local_3c8,0x11,1,&local_44c);
            stbtt__dict_get_ints(&local_3c8,0x106,1,(stbtt_uint32 *)&local_3f8);
            stbtt__dict_get_ints(&local_3c8,0x124,1,&local_414);
            stbtt__dict_get_ints(&local_3c8,0x125,1,&local_418);
            sVar73.data._4_4_ = in_stack_fffffffffffffb74;
            sVar73.data._0_4_ = sVar19;
            sVar73._8_8_ = atlas;
            sVar73 = stbtt__get_subrs(sVar73,in_stack_fffffffffffffb98);
            sVar18 = local_418;
            sVar23 = local_44c;
            *(stbtt__buf *)((long)pvVar29 + lVar27 * 0xc0 + 0x70) = sVar73;
            if (((stbtt_uint32)local_3f8 == 2) && (local_44c != 0)) {
              if (local_414 != 0) {
                uVar35 = (ulong)local_418;
                if (uVar35 == 0) goto LAB_001af3c2;
                if (((int)local_414 < 0) || (local_238[0].size < (int)local_414)) goto LAB_001af540;
                local_238[0].cursor = local_414;
                sVar73 = stbtt__cff_get_index(local_238);
                *(stbtt__buf *)((long)pvVar29 + lVar27 * 0xc0 + 0x80) = sVar73;
                puVar30 = local_238[0].data + uVar35;
                lVar38 = (ulong)(local_238[0].size - sVar18) << 0x20;
                if ((int)(local_238[0].size - sVar18 | sVar18) < 0 ||
                    local_238[0].size < (int)sVar18) {
                  puVar30 = (uchar *)0x0;
                  lVar38 = 0;
                }
                *(uchar **)((long)pvVar29 + lVar27 * 0xc0 + 0x90) = puVar30;
                *(long *)((long)pvVar29 + lVar27 * 0xc0 + 0x98) = lVar38;
              }
              if (((int)sVar23 < 0) || (local_238[0].size < (int)sVar23)) {
LAB_001af540:
                __assert_fail("!(o > b->size || o < 0)",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                              ,0x45c,"void stbtt__buf_seek(stbtt__buf *, int)");
              }
              local_238[0].cursor = sVar23;
              sVar73 = stbtt__cff_get_index(local_238);
              *(stbtt__buf *)((long)pvVar29 + lVar27 * 0xc0 + 0x50) = sVar73;
              goto LAB_001ace96;
            }
          }
          goto LAB_001af3c2;
        }
        if (local_3e8._0_4_ == 0) goto LAB_001af3c2;
LAB_001ace96:
        sVar23 = stbtt__find_table(data,(stbtt_uint32)in_stack_fffffffffffffb98.data,"maxp");
        if (sVar23 == 0) {
          uVar24 = 0xffff;
        }
        else {
          uVar24 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar23 + 4) << 8 |
                                 *(ushort *)(data + (ulong)sVar23 + 4) >> 8);
        }
        *(uint *)((long)pvVar29 + lVar27 * 0xc0 + 0x14) = uVar24;
        uVar16 = *(ushort *)(data + (uVar15 & 0xffffffff) + 2) << 8 |
                 *(ushort *)(data + (uVar15 & 0xffffffff) + 2) >> 8;
        *(undefined4 *)((long)pvVar29 + lVar27 * 0xc0 + 0x34) = 0;
        if (uVar16 != 0) {
          uVar24 = iVar43 + 4;
          uVar35 = (ulong)uVar16;
          do {
            uVar16 = *(ushort *)(data + uVar24) << 8 | *(ushort *)(data + uVar24) >> 8;
            if ((uVar16 == 0) ||
               ((uVar16 == 3 &&
                ((uVar16 = *(ushort *)(data + (ulong)uVar24 + 2) << 8 |
                           *(ushort *)(data + (ulong)uVar24 + 2) >> 8, uVar16 == 10 || (uVar16 == 1)
                 ))))) {
              uVar47 = *(uint *)(data + (ulong)uVar24 + 4);
              *(uint *)((long)pvVar29 + lVar27 * 0xc0 + 0x34) =
                   (uVar47 >> 0x18 | (uVar47 & 0xff0000) >> 8 | (uVar47 & 0xff00) << 8 |
                   uVar47 << 0x18) + iVar43;
            }
            uVar24 = uVar24 + 8;
            uVar35 = uVar35 - 1;
          } while (uVar35 != 0);
        }
        if (*(int *)((long)pvVar29 + lVar27 * 0xc0 + 0x34) == 0) goto LAB_001af3c2;
        *(uint *)((long)pvVar29 + lVar27 * 0xc0 + 0x38) =
             (uint)(ushort)(*(ushort *)
                             (data + (long)*(int *)((long)pvVar29 + lVar27 * 0xc0 + 0x1c) + 0x32) <<
                            8 | *(ushort *)
                                 (data + (long)*(int *)((long)pvVar29 + lVar27 * 0xc0 + 0x1c) + 0x32
                                 ) >> 8);
        lVar27 = lVar27 + 1;
        iVar43 = (atlas->ConfigData).Size;
        local_320 = (undefined4)CONCAT71((int7)(int3)((uint)iVar43 >> 8),iVar43 <= lVar27);
      } while (lVar27 < iVar43);
    }
    lVar27 = (long)(int)(uint)local_3d0;
    sVar52 = lVar27 * 0x1c;
    pvVar29 = ImGui::MemAlloc(sVar52);
    size = lVar27 << 4;
    __s = ImGui::MemAlloc(size);
    lVar27 = (long)(int)local_3d8;
    __s_00 = ImGui::MemAlloc(lVar27 * 0x28);
    memset(pvVar29,0,sVar52);
    local_2f8 = __s;
    memset(__s,0,size);
    local_2f0 = __s_00;
    memset(__s_00,0,lVar27 * 0x28);
    local_470 = 0;
    iVar25 = 0;
    iVar43 = 0;
    local_300 = pvVar29;
    if (0 < (atlas->ConfigData).Size) {
      psVar32 = (stbtt__edge *)0x0;
      iVar25 = 0;
      local_470 = 0;
      iVar43 = 0;
      do {
        pIVar28 = (atlas->ConfigData).Data;
        pIVar8 = pIVar28[(long)psVar32].GlyphRanges;
        IVar46 = *pIVar8;
        local_330 = 0;
        local_420 = (void *)0x0;
        if (IVar46 != 0) {
          local_330 = 0;
          local_420 = (void *)0x0;
          do {
            if (pIVar8[local_330 * 2 + 1] == 0) break;
            local_420 = (void *)(ulong)(((int)local_420 - (uint)IVar46) +
                                        (uint)pIVar8[local_330 * 2 + 1] + 1);
            IVar46 = pIVar8[local_330 * 2 + 2];
            local_330 = local_330 + 1;
          } while (IVar46 != 0);
        }
        psVar44 = (stbtt_fontinfo *)((long)psVar32 * 0xc0 + (long)local_408);
        pfVar39 = (float *)((long)local_2f0 + (ulong)local_470 * 0x28);
        *(float **)&psVar44[1].fontstart = pfVar39;
        psVar44[1].loca = (int)local_330;
        if ((int)local_330 != 0) {
          fVar61 = pIVar28[(long)psVar32].SizePixels;
          uVar35 = 0;
          do {
            *pfVar39 = fVar61;
            uVar16 = pIVar8[uVar35 * 2];
            pfVar39[1] = (float)(uint)uVar16;
            iVar55 = (uint)pIVar8[uVar35 * 2 + 1] - (uint)uVar16;
            pfVar39[4] = (float)(iVar55 + 1);
            *(void **)(pfVar39 + 6) = (void *)((long)iVar43 * 0x1c + (long)local_300);
            iVar43 = iVar55 + iVar43 + 1;
            uVar35 = uVar35 + 1;
            pfVar39 = pfVar39 + 10;
          } while ((local_330 & 0xffffffff) != uVar35);
        }
        local_410 = (stbtt__point *)CONCAT44(local_410._4_4_,iVar43);
        local_368 = (float *)CONCAT44(local_368._4_4_,iVar25);
        psVar44[1].userdata = (void *)((long)iVar25 * 0x10 + (long)local_2f8);
        *(int *)&psVar44[1].data = (int)local_420;
        local_360 = psVar32;
        stbtt_PackSetOversampling
                  (&local_3b8,pIVar28[(long)psVar32].OversampleH,pIVar28[(long)psVar32].OversampleV)
        ;
        iVar43 = psVar44[1].loca;
        if ((long)iVar43 < 1) {
          uVar24 = 0;
        }
        else {
          lVar27._0_4_ = psVar44[1].fontstart;
          lVar27._4_4_ = psVar44[1].numGlyphs;
          puVar30 = (uchar *)(local_3b8._32_8_ & 0xffffffff);
          in_stack_fffffffffffffb98.data = puVar30;
          local_448 = (ulong)local_3b8._32_8_ >> 0x20;
          local_43c = (float)local_448;
          sVar6 = (short)local_3b8.v_oversample;
          sVar17 = (short)local_3b8.padding;
          local_348._0_8_ = (long)psVar44[1].userdata + 6;
          lVar38 = 0;
          uVar24 = 0;
          local_328 = lVar27;
          do {
            fVar61 = *(float *)(lVar27 + lVar38 * 0x28);
            uVar64 = 0;
            uVar65 = 0;
            uVar66 = 0;
            if (fVar61 <= 0.0) {
              uVar64 = 0x80000000;
              uVar65 = 0x80000000;
              uVar66 = 0x80000000;
              fVar61 = -fVar61;
              uVar47 = (uint)(ushort)(*(ushort *)(psVar44->data + (long)psVar44->head + 0x12) << 8 |
                                     *(ushort *)(psVar44->data + (long)psVar44->head + 0x12) >> 8);
            }
            else {
              puVar9 = psVar44->data;
              lVar40 = (long)psVar44->hhea;
              uVar47 = ((int)(short)((ushort)puVar9[lVar40 + 4] << 8) | (uint)puVar9[lVar40 + 5]) -
                       ((int)(short)((ushort)puVar9[lVar40 + 6] << 8) | (uint)puVar9[lVar40 + 7]);
            }
            lVar40 = lVar27 + lVar38 * 0x28;
            *(char *)(lVar40 + 0x20) = (char)in_stack_fffffffffffffb98.data;
            *(char *)(lVar40 + 0x21) = (char)local_448;
            if (0 < *(int *)(lVar40 + 0x10)) {
              local_3e8._0_8_ = lVar38;
              fVar60 = (fVar61 / (float)(int)uVar47) * (float)(long)puVar30;
              local_438._4_4_ = uVar64;
              local_438._0_4_ = (fVar61 / (float)(int)uVar47) * local_43c;
              local_438._8_4_ = uVar65;
              local_438._12_4_ = uVar66;
              psVar56 = (short *)((long)(int)uVar24 * 0x10 + local_348._0_8_);
              lVar27 = 0;
              do {
                if (*(long *)(lVar40 + 8) == 0) {
                  iVar25 = *(int *)(lVar40 + 4) + (int)lVar27;
                }
                else {
                  iVar25 = *(int *)(*(long *)(lVar40 + 8) + lVar27 * 4);
                }
                iVar25 = stbtt_FindGlyphIndex(psVar44,iVar25);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar44,iVar25,fVar60,(float)local_438._0_4_,in_XMM2_Da,in_XMM3_Da,
                           (int *)local_238,(int *)&local_3c8,(int *)&local_3f8,(int *)&local_44c);
                psVar56[-1] = (((short)(stbtt_uint32)local_3f8 +
                               (short)in_stack_fffffffffffffb98.data) - (short)local_238[0].data) +
                              sVar17 + -1;
                *psVar56 = ~(ushort)local_3c8.data + (short)local_44c + sVar6 + sVar17;
                lVar27 = lVar27 + 1;
                psVar56 = psVar56 + 8;
              } while (lVar27 < *(int *)(lVar40 + 0x10));
              uVar24 = uVar24 + (int)lVar27;
              lVar27 = local_328;
              lVar38 = local_3e8._0_8_;
            }
            lVar38 = lVar38 + 1;
          } while (lVar38 != iVar43);
        }
        if (uVar24 != (uint)local_420) {
          __assert_fail("n == font_glyphs_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0x704,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        if (0 < psVar44[1].loca) {
          lVar27 = 0;
          iVar43 = 0;
          do {
            lVar38 = *(long *)&psVar44[1].fontstart;
            if (0 < *(int *)(lVar38 + 0x10 + lVar27 * 0x28)) {
              uVar35 = (long)iVar43 << 4 | 6;
              iVar25 = 0;
              do {
                iVar55 = stbtt_FindGlyphIndex(psVar44,*(int *)(lVar38 + 4 + lVar27 * 0x28) + iVar25)
                ;
                if (iVar55 == 0) {
                  *(undefined4 *)((long)psVar44[1].userdata + (uVar35 - 2)) = 0;
                }
                iVar25 = iVar25 + 1;
                lVar38 = *(long *)&psVar44[1].fontstart;
                uVar35 = uVar35 + 0x10;
              } while (iVar25 < *(int *)(lVar38 + 0x10 + lVar27 * 0x28));
              iVar43 = iVar43 + iVar25;
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 < psVar44[1].loca);
        }
        stbrp_pack_rects((stbrp_context *)local_3b8.pack_info,(stbrp_rect *)psVar44[1].userdata,
                         uVar24);
        if (0 < (int)uVar24) {
          pvVar29 = psVar44[1].userdata;
          lVar27 = 0;
          do {
            if ((*(short *)((long)pvVar29 + lVar27 + 4) == 0) &&
               (*(short *)((long)pvVar29 + lVar27 + 6) == 0)) {
              *(undefined4 *)((long)pvVar29 + lVar27 + 0xc) = 0;
            }
            if (*(int *)((long)pvVar29 + lVar27 + 0xc) != 0) {
              iVar43 = (uint)*(ushort *)((long)pvVar29 + lVar27 + 6) +
                       (uint)*(ushort *)((long)pvVar29 + lVar27 + 10);
              if (iVar43 < atlas->TexHeight) {
                iVar43 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar43;
            }
            lVar27 = lVar27 + 0x10;
          } while ((ulong)uVar24 << 4 != lVar27);
        }
        local_470 = (int)local_330 + local_470;
        iVar25 = (int)local_420 + (int)local_368;
        psVar32 = (stbtt__edge *)((long)&local_360->x0 + 1);
        iVar43 = (int)local_410;
      } while ((long)psVar32 < (long)(atlas->ConfigData).Size);
    }
    if (iVar25 != (int)local_3d0) {
      __assert_fail("buf_rects_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71b,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if (iVar43 != (int)local_3d0) {
      __assert_fail("buf_packedchars_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if (local_470 != (uint)local_3d8) {
      __assert_fail("buf_ranges_n == total_ranges_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    uVar24 = atlas->TexHeight;
    if ((atlas->Flags & 1) == 0) {
      uVar24 = (int)(uVar24 - 1) >> 1 | uVar24 - 1;
      uVar24 = (int)uVar24 >> 2 | uVar24;
      uVar24 = (int)uVar24 >> 4 | uVar24;
      uVar24 = (int)uVar24 >> 8 | uVar24;
      uVar24 = (int)uVar24 >> 0x10 | uVar24;
    }
    iVar25 = uVar24 + 1;
    atlas->TexHeight = iVar25;
    iVar43 = atlas->TexWidth;
    (atlas->TexUvScale).x = 1.0 / (float)iVar43;
    (atlas->TexUvScale).y = 1.0 / (float)iVar25;
    puVar30 = (uchar *)ImGui::MemAlloc((long)(iVar25 * iVar43));
    atlas->TexPixelsAlpha8 = puVar30;
    memset(puVar30,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
    local_3b8.pixels = atlas->TexPixelsAlpha8;
    local_3b8.height = atlas->TexHeight;
    if (0 < (atlas->ConfigData).Size) {
      lVar27 = 0;
      do {
        pvVar29 = local_408;
        local_2a8 = (atlas->ConfigData).Data;
        local_2b0 = lVar27 * 0x80;
        lVar38 = lVar27 * 0xc0;
        local_400 = (stbtt_fontinfo *)((long)local_408 + lVar38);
        local_2a0 = lVar27;
        stbtt_PackSetOversampling
                  (&local_3b8,local_2a8[lVar27].OversampleH,local_2a8[lVar27].OversampleV);
        local_298 = (long)*(int *)((long)pvVar29 + lVar38 + 0xb8);
        local_318 = local_3b8.h_oversample;
        local_31c = local_3b8.v_oversample;
        if (0 < local_298) {
          lVar27 = *(long *)((long)local_408 + lVar38 + 0xa0);
          local_2e8 = *(long *)((long)local_408 + lVar38 + 0xb0);
          lVar40 = 0;
          lVar38 = 0;
          local_288 = lVar27;
          do {
            local_290 = lVar40;
            fVar61 = *(float *)(local_2e8 + lVar40 * 0x28);
            if (fVar61 <= 0.0) {
              uStack_2c4 = 0x80000000;
              uStack_2c0 = 0x80000000;
              uStack_2bc = 0x80000000;
              fVar61 = -fVar61;
              uVar24 = (uint)(ushort)(*(ushort *)(local_400->data + (long)local_400->head + 0x12) <<
                                      8 | *(ushort *)
                                           (local_400->data + (long)local_400->head + 0x12) >> 8);
            }
            else {
              puVar30 = local_400->data;
              lVar41 = (long)local_400->hhea;
              uVar24 = ((int)(short)((ushort)puVar30[lVar41 + 4] << 8) | (uint)puVar30[lVar41 + 5])
                       - ((int)(short)((ushort)puVar30[lVar41 + 6] << 8) | (uint)puVar30[lVar41 + 7]
                         );
              uStack_2c4 = 0;
              uStack_2c0 = 0;
              uStack_2bc = 0;
            }
            local_2c8 = fVar61 / (float)(int)uVar24;
            lVar40 = local_2e8 + lVar40 * 0x28;
            bVar3 = *(byte *)(lVar40 + 0x20);
            fVar61 = (float)bVar3;
            local_350 = 0.0;
            local_354 = 0.0;
            if (bVar3 != 0) {
              local_354 = (float)(int)(1 - (uint)bVar3) / (fVar61 + fVar61);
            }
            local_3b8.v_oversample._0_1_ = *(byte *)(lVar40 + 0x21);
            local_3b8.h_oversample = (uint)bVar3;
            local_3b8.v_oversample._1_3_ = 0;
            fVar60 = (float)(byte)local_3b8.v_oversample;
            if ((byte)local_3b8.v_oversample != 0) {
              local_350 = (float)(int)(1 - (uint)(byte)local_3b8.v_oversample) / (fVar60 + fVar60);
            }
            if (0 < *(int *)(lVar40 + 0x10)) {
              fVar61 = 1.0 / fVar61;
              local_310 = fVar61;
              local_314 = 1.0 / fVar60;
              lVar38 = (long)(int)lVar38;
              lVar41 = 0;
              local_280 = lVar40;
              do {
                psVar44 = local_400;
                iVar43 = 0;
                uVar65 = 0;
                uVar64 = 0;
                if (*(int *)(lVar27 + 0xc + lVar38 * 0x10) != 0) {
                  if (*(long *)(lVar40 + 8) == 0) {
                    iVar25 = *(int *)(lVar40 + 4) + (int)lVar41;
                  }
                  else {
                    iVar25 = *(int *)(*(long *)(lVar40 + 8) + lVar41 * 4);
                  }
                  lVar27 = lVar38 * 0x10 + lVar27;
                  local_278 = (short *)(lVar41 * 0x1c + *(long *)(lVar40 + 0x18));
                  local_270 = lVar41;
                  local_268 = lVar38;
                  iVar55 = stbtt_FindGlyphIndex(local_400,iVar25);
                  *(short *)(lVar27 + 8) = *(short *)(lVar27 + 8) + (short)local_3b8.padding;
                  *(short *)(lVar27 + 10) = *(short *)(lVar27 + 10) + (short)local_3b8.padding;
                  *(short *)(lVar27 + 4) = *(short *)(lVar27 + 4) - (short)local_3b8.padding;
                  *(short *)(lVar27 + 6) = *(short *)(lVar27 + 6) - (short)local_3b8.padding;
                  puVar30 = psVar44->data;
                  uVar16 = *(ushort *)(puVar30 + (long)psVar44->hhea + 0x22) << 8 |
                           *(ushort *)(puVar30 + (long)psVar44->hhea + 0x22) >> 8;
                  iVar25 = psVar44->hmtx;
                  lVar38 = (ulong)uVar16 * 4 + (long)iVar25 + -4;
                  lVar40 = (ulong)uVar16 * 4 + (long)iVar25 + -3;
                  if (iVar55 < (int)(uint)uVar16) {
                    lVar38 = (long)(iVar55 * 4) + (long)iVar25;
                    lVar40 = (long)(iVar55 * 4) + 1 + (long)iVar25;
                  }
                  local_308 = (uint)puVar30[lVar38];
                  local_30c = (uint)puVar30[lVar40];
                  uVar24 = local_3b8.h_oversample;
                  uVar47 = local_3b8.v_oversample;
                  fVar62 = (float)(local_3b8._32_8_ & 0xffffffff) * local_2c8;
                  local_438._0_4_ = fVar62;
                  in_stack_fffffffffffffb98.data._4_4_ = uVar64;
                  in_stack_fffffffffffffb98.data._0_4_ = (float)local_3b8.v_oversample * local_2c8;
                  in_stack_fffffffffffffb98.cursor = uVar65;
                  in_stack_fffffffffffffb98.size = iVar43;
                  fVar60 = local_2c8;
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (psVar44,iVar55,fVar62,(float)local_3b8.v_oversample * local_2c8,
                             local_2c8,fVar61,(int *)&local_418,&local_304,&local_23c,&local_240);
                  local_2d8 = local_3b8.pixels + *(ushort *)(lVar27 + 8);
                  uVar16 = *(ushort *)(lVar27 + 10);
                  local_2e0 = (long)local_3b8.stride_in_bytes;
                  uVar24 = *(ushort *)(lVar27 + 4) - uVar24;
                  uVar35 = (ulong)uVar24;
                  uVar5 = *(ushort *)(lVar27 + 6);
                  uVar26 = stbtt_GetGlyphShape(psVar44,iVar55,(stbtt_vertex **)&local_3f8);
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (psVar44,iVar55,(float)local_438._0_4_,
                             in_stack_fffffffffffffb98.data._0_4_,fVar60,fVar61,(int *)&local_44c,
                             (int *)&local_414,(int *)0x0,(int *)0x0);
                  uVar24 = uVar24 + 1;
                  local_3d0 = uVar35;
                  local_378 = lVar27;
                  if (uVar24 != 0) {
                    local_34c = uVar5 - uVar47;
                    local_448 = CONCAT44(local_448._4_4_,local_34c + 1);
                    if (local_34c + 1 != 0) {
                      lVar38 = CONCAT44(local_3f8._4_4_,(stbtt_uint32)local_3f8);
                      local_348._0_4_ = local_44c;
                      local_3ec = local_414;
                      local_238[0].data = (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                      if ((int)uVar26 < 1) {
                        uVar35 = 0;
                      }
                      else {
                        lVar40 = 0;
                        uVar35 = 0;
                        do {
                          uVar35 = (ulong)((int)uVar35 +
                                          (uint)(*(char *)(lVar38 + 0xc + lVar40) == '\x01'));
                          lVar40 = lVar40 + 0xe;
                        } while ((ulong)uVar26 * 0xe != lVar40);
                      }
                      if ((int)uVar35 == 0) {
                        pvVar29 = (void *)0x0;
LAB_001adca5:
                        points = (stbtt__point *)0x0;
                      }
                      else {
                        pvVar29 = ImGui::MemAlloc((long)(int)uVar35 << 2);
                        if (pvVar29 == (void *)0x0) {
                          uVar35 = 0;
                          goto LAB_001adca5;
                        }
                        fVar61 = in_stack_fffffffffffffb98.data._0_4_;
                        if ((float)local_438._0_4_ <= in_stack_fffffffffffffb98.data._0_4_) {
                          fVar61 = (float)local_438._0_4_;
                        }
                        fVar61 = (0.35 / fVar61) * (0.35 / fVar61);
                        uVar31 = 0;
                        iVar43 = 0;
                        points = (stbtt__point *)0x0;
                        local_420 = pvVar29;
                        do {
                          if ((int)uVar31 == 0) {
LAB_001ada92:
                            local_238[0].data =
                                 (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                            if ((int)uVar26 < 1) {
                              lVar27 = -1;
                            }
                            else {
                              local_3e8._0_8_ = uVar31;
                              uVar47 = 0xffffffff;
                              fVar62 = 0.0;
                              lVar27 = 0;
                              fVar60 = 0.0;
                              local_410 = points;
                              do {
                                puVar30 = local_238[0].data;
                                switch(*(undefined1 *)(lVar38 + 0xc + lVar27)) {
                                case 1:
                                  if (-1 < (int)uVar47) {
                                    *(int *)((long)local_420 + (ulong)uVar47 * 4) =
                                         (int)local_238[0].data - iVar43;
                                  }
                                  uVar47 = uVar47 + 1;
                                  sVar6 = *(short *)(lVar38 + lVar27);
                                  sVar17 = *(short *)(lVar38 + 2 + lVar27);
                                  iVar43 = (int)local_238[0].data;
                                  break;
                                case 2:
                                  sVar6 = *(short *)(lVar38 + lVar27);
                                  sVar17 = *(short *)(lVar38 + 2 + lVar27);
                                  break;
                                case 3:
                                  stbtt__tesselate_curve
                                            (points,(int *)local_238,fVar60,fVar62,
                                             (float)(int)*(short *)(lVar38 + 4 + lVar27),
                                             (float)(int)*(short *)(lVar38 + 6 + lVar27),
                                             (float)(int)*(short *)(lVar38 + lVar27),
                                             (float)(int)*(short *)(lVar38 + 2 + lVar27),fVar61,0);
                                  goto LAB_001adbf1;
                                case 4:
                                  stbtt__tesselate_cubic
                                            (points,(int *)local_238,fVar60,fVar62,
                                             (float)(int)*(short *)(lVar38 + 4 + lVar27),
                                             (float)(int)*(short *)(lVar38 + 6 + lVar27),
                                             (float)(int)*(short *)(lVar38 + 8 + lVar27),
                                             (float)(int)*(short *)(lVar38 + 10 + lVar27),
                                             (float)(int)*(short *)(lVar38 + lVar27),
                                             (float)(int)*(short *)(lVar38 + 2 + lVar27),fVar61,0);
LAB_001adbf1:
                                  fVar60 = (float)(int)*(short *)(lVar38 + lVar27);
                                  fVar62 = (float)(int)*(short *)(lVar38 + 2 + lVar27);
                                  points = local_410;
                                  puVar30 = local_238[0].data;
                                default:
                                  goto switchD_001adae5_default;
                                }
                                puVar30 = (uchar *)CONCAT44(local_238[0].data._4_4_,
                                                            (int)local_238[0].data + 1);
                                fVar62 = (float)(int)sVar17;
                                fVar60 = (float)(int)sVar6;
                                if (points != (stbtt__point *)0x0) {
                                  points[(int)local_238[0].data].x = fVar60;
                                  points[(int)local_238[0].data].y = fVar62;
                                }
switchD_001adae5_default:
                                local_238[0].data = puVar30;
                                lVar27 = lVar27 + 0xe;
                              } while ((ulong)uVar26 * 0xe != lVar27);
                              lVar27 = (long)(int)uVar47;
                              uVar31 = local_3e8._0_8_;
                              pvVar29 = local_420;
                            }
                            *(int *)((long)pvVar29 + lVar27 * 4) = (int)local_238[0].data - iVar43;
                            bVar11 = true;
                          }
                          else {
                            points = (stbtt__point *)
                                     ImGui::MemAlloc((long)(int)local_238[0].data << 3);
                            if (points != (stbtt__point *)0x0) goto LAB_001ada92;
                            points = (stbtt__point *)0x0;
                            bVar11 = false;
                          }
                          if (!bVar11) {
                            ImGui::MemFree(points);
                            ImGui::MemFree(pvVar29);
                            uVar35 = 0;
                            pvVar29 = (void *)0x0;
                            points = (stbtt__point *)0x0;
                            lVar27 = local_378;
                            break;
                          }
                          iVar25 = (int)uVar31;
                          uVar31 = (ulong)(iVar25 + 1);
                          lVar27 = local_378;
                        } while (iVar25 == 0);
                      }
                      if (points != (stbtt__point *)0x0) {
                        if ((int)uVar35 < 1) {
                          sVar52 = 0x14;
                        }
                        else {
                          uVar31 = 0;
                          lVar38 = 0;
                          do {
                            lVar38 = (long)(int)lVar38 + (long)*(int *)((long)pvVar29 + uVar31 * 4);
                            uVar31 = uVar31 + 1;
                          } while (uVar35 != uVar31);
                          sVar52 = lVar38 * 0x14 + 0x14;
                        }
                        local_410 = points;
                        psVar32 = (stbtt__edge *)ImGui::MemAlloc(sVar52);
                        local_360 = psVar32;
                        if (psVar32 != (stbtt__edge *)0x0) {
                          if ((int)uVar35 < 1) {
                            uVar47 = 0;
                          }
                          else {
                            uVar47 = in_stack_fffffffffffffb98.cursor;
                            uVar26 = in_stack_fffffffffffffb98.size;
                            in_stack_fffffffffffffb98.data =
                                 (uchar *)((ulong)in_stack_fffffffffffffb98.data ^
                                          0x8000000080000000);
                            in_stack_fffffffffffffb98.cursor = uVar47 ^ 0x80000000;
                            in_stack_fffffffffffffb98.size = uVar26 ^ 0x80000000;
                            uVar31 = 0;
                            uVar47 = 0;
                            iVar43 = 0;
                            do {
                              iVar25 = *(int *)((long)pvVar29 + uVar31 * 4);
                              if (0 < iVar25) {
                                uVar42 = (ulong)(iVar25 - 1);
                                uVar49 = 0;
                                do {
                                  iVar55 = (int)uVar42;
                                  fVar61 = local_410[(long)iVar43 + (long)iVar55].y;
                                  fVar60 = local_410[(long)iVar43 + uVar49].y;
                                  if ((fVar61 != fVar60) || (NAN(fVar61) || NAN(fVar60))) {
                                    iVar54 = (int)uVar49;
                                    iVar50 = iVar55;
                                    if (fVar61 <= fVar60) {
                                      iVar50 = iVar54;
                                      iVar54 = iVar55;
                                    }
                                    psVar32[(int)uVar47].invert = (uint)(fVar60 < fVar61);
                                    psVar32[(int)uVar47].x0 =
                                         local_410[(long)iVar43 + (long)iVar50].x *
                                         (float)local_438._0_4_ + 0.0;
                                    psVar32[(int)uVar47].y0 =
                                         local_410[(long)iVar43 + (long)iVar50].y *
                                         SUB84(in_stack_fffffffffffffb98.data,0) + 0.0;
                                    psVar32[(int)uVar47].x1 =
                                         local_410[(long)iVar43 + (long)iVar54].x *
                                         (float)local_438._0_4_ + 0.0;
                                    psVar32[(int)uVar47].y1 =
                                         local_410[(long)iVar43 + (long)iVar54].y *
                                         SUB84(in_stack_fffffffffffffb98.data,0) + 0.0;
                                    uVar47 = uVar47 + 1;
                                  }
                                  uVar42 = uVar49 & 0xffffffff;
                                  uVar49 = uVar49 + 1;
                                } while ((long)uVar49 < (long)*(int *)((long)pvVar29 + uVar31 * 4));
                              }
                              iVar43 = iVar43 + iVar25;
                              uVar31 = uVar31 + 1;
                            } while (uVar31 != uVar35);
                          }
                          local_420 = pvVar29;
                          stbtt__sort_edges_quicksort(psVar32,uVar47);
                          if (1 < (int)uVar47) {
                            uVar35 = 1;
                            do {
                              fVar61 = psVar32[uVar35].x0;
                              fVar60 = psVar32[uVar35].y0;
                              iVar43 = psVar32[uVar35].invert;
                              local_238[0].cursor = iVar43;
                              local_238[0].data = *(uchar **)&psVar32[uVar35].x1;
                              uVar31 = uVar35 & 0xffffffff;
                              do {
                                uVar26 = (uint)uVar31;
                                if ((int)uVar26 < 1) break;
                                fVar62 = psVar32[uVar31 - 1].y0;
                                if (fVar60 < fVar62) {
                                  psVar1 = psVar32 + uVar31;
                                  psVar1->invert = psVar1[-1].invert;
                                  fVar63 = psVar1[-1].y0;
                                  fVar69 = psVar1[-1].x1;
                                  fVar67 = psVar1[-1].y1;
                                  psVar1->x0 = psVar1[-1].x0;
                                  psVar1->y0 = fVar63;
                                  psVar1->x1 = fVar69;
                                  psVar1->y1 = fVar67;
                                  uVar31 = (ulong)(uVar26 - 1);
                                }
                                uVar26 = (uint)uVar31;
                              } while (fVar60 < fVar62);
                              if (uVar35 != uVar26) {
                                psVar32[(int)uVar26].x0 = fVar61;
                                psVar32[(int)uVar26].y0 = fVar60;
                                *(uchar **)&psVar32[(int)uVar26].x1 = local_238[0].data;
                                psVar32[(int)uVar26].invert = iVar43;
                              }
                              uVar35 = uVar35 + 1;
                            } while (uVar35 != uVar47);
                          }
                          auVar13._8_8_ = 0;
                          auVar13._0_4_ = local_3c8.cursor;
                          auVar13._4_4_ = local_3c8.size;
                          local_3c8 = (stbtt__buf)(auVar13 << 0x40);
                          scanline = local_238;
                          if (0x40 < (int)uVar24) {
                            scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)uVar24 * 8 + 4);
                          }
                          psVar32[(int)uVar47].y0 =
                               (float)(int)((int)(float)local_448 + local_3ec) + 1.0;
                          if (local_34c < 0x7fffffff) {
                            local_2d8 = local_2d8 + (ulong)uVar16 * local_2e0;
                            local_330 = CONCAT44(local_330._4_4_,(float)(int)local_348._0_4_);
                            local_260 = (long)(int)uVar24;
                            local_368 = (float *)((long)&scanline->data + local_260 * 4);
                            local_2d0 = local_368 + 1;
                            local_250 = local_260 * 4;
                            local_43c = (float)(int)uVar24;
                            local_258 = (long)((int)local_3d0 + 2) << 2;
                            local_3d8 = 0;
                            uVar35 = 0;
                            local_370 = (undefined8 *)0x0;
                            local_470 = 0;
                            psVar57 = (stbtt__buf *)0x0;
                            sVar23 = local_3ec;
                            do {
                              local_448 = CONCAT44(local_448._4_4_,(float)(int)sVar23);
                              fVar61 = (float)(int)sVar23 + 1.0;
                              local_3ec = sVar23;
                              local_248 = uVar35;
                              memset(scanline,0,local_250);
                              memset(local_368,0,local_258);
                              puVar48 = local_370;
                              if ((stbtt__buf *)local_3c8.data != (stbtt__buf *)0x0) {
                                psVar34 = (stbtt__buf *)local_3c8.data;
                                psVar36 = &local_3c8;
                                do {
                                  psVar37 = psVar34;
                                  if ((float)psVar34[1].size <= (float)local_448) {
                                    psVar36->data = psVar34->data;
                                    fVar60 = *(float *)((long)&psVar34[1].data + 4);
                                    if ((fVar60 == 0.0) && (!NAN(fVar60))) {
                                      __assert_fail("z->direction",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xc4f,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                    }
                                    puVar30 = (uchar *)((long)&psVar34[1].data + 4);
                                    puVar30[0] = '\0';
                                    puVar30[1] = '\0';
                                    puVar30[2] = '\0';
                                    puVar30[3] = '\0';
                                    psVar34->data = (uchar *)psVar57;
                                    psVar37 = psVar36;
                                    psVar57 = psVar34;
                                  }
                                  psVar34 = (stbtt__buf *)psVar37->data;
                                  psVar36 = psVar37;
                                } while (psVar34 != (stbtt__buf *)0x0);
                              }
                              fVar60 = psVar32->y0;
                              fVar62 = (float)local_448;
                              while (fVar60 <= fVar61) {
                                psVar34 = psVar57;
                                if ((fVar60 != psVar32->y1) || (NAN(fVar60) || NAN(psVar32->y1))) {
                                  if (psVar57 == (stbtt__buf *)0x0) {
                                    if (local_470 == 0) {
                                      puVar33 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      fVar62 = (float)local_448;
                                      if (puVar33 == (undefined8 *)0x0) {
                                        psVar57 = (stbtt__buf *)0x0;
                                        goto LAB_001ae16d;
                                      }
                                      *puVar33 = puVar48;
                                      local_470 = 800;
                                      puVar48 = puVar33;
                                    }
                                    lVar27 = (long)(int)local_470;
                                    local_470 = local_470 + -1;
                                    psVar57 = (stbtt__buf *)(puVar48 + lVar27 * 4 + -3);
                                  }
                                  else {
                                    psVar34 = (stbtt__buf *)psVar57->data;
                                  }
LAB_001ae16d:
                                  if (psVar57 == (stbtt__buf *)0x0) {
                                    __assert_fail("z != __null",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xabf,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                 );
                                  }
                                  fVar60 = psVar32->x0;
                                  fVar63 = psVar32->y0;
                                  fVar69 = psVar32->y1;
                                  fVar67 = (psVar32->x1 - fVar60) / (fVar69 - fVar63);
                                  psVar57->size = (int)fVar67;
                                  *(uint *)&psVar57[1].data =
                                       -(uint)(fVar67 != 0.0) & (uint)(1.0 / fVar67);
                                  psVar57->cursor =
                                       (int)(((fVar62 - fVar63) * fVar67 + fVar60) -
                                            (float)local_330);
                                  *(undefined4 *)((long)&psVar57[1].data + 4) =
                                       *(undefined4 *)
                                        (&DAT_001e5ffc + (ulong)(psVar32->invert == 0) * 4);
                                  psVar57[1].cursor = (int)fVar63;
                                  psVar57[1].size = (int)fVar69;
                                  psVar57->data = (uchar *)0x0;
                                  if (fVar69 < fVar62) {
                                    __assert_fail("z->ey >= scan_y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xc5c,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar57->data = local_3c8.data;
                                  local_3c8.data = (uchar *)psVar57;
                                }
                                psVar1 = psVar32 + 1;
                                psVar32 = psVar32 + 1;
                                psVar57 = psVar34;
                                fVar60 = psVar1->y0;
                              }
                              local_370 = puVar48;
                              for (e = (stbtt__active_edge *)local_3c8.data;
                                  e != (stbtt__active_edge *)0x0; e = e->next) {
                                fVar60 = e->ey;
                                if (fVar60 < fVar62) {
                                  __assert_fail("e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                ,0xb93,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar63 = e->fx;
                                fVar69 = e->fdx;
                                if ((fVar69 != 0.0) || (NAN(fVar69))) {
                                  fVar67 = e->sy;
                                  if (fVar61 < fVar67) {
                                    __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xba6,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar72 = fVar69 + fVar63;
                                  fVar68 = (float)(~-(uint)(fVar62 < fVar67) & (uint)fVar63 |
                                                  (uint)((fVar67 - fVar62) * fVar69 + fVar63) &
                                                  -(uint)(fVar62 < fVar67));
                                  if ((((fVar68 < 0.0) ||
                                       (fVar71 = (float)(~-(uint)(fVar60 < fVar61) & (uint)fVar72 |
                                                        (uint)((fVar60 - fVar62) * fVar69 + fVar63)
                                                        & -(uint)(fVar60 < fVar61)), fVar71 < 0.0))
                                      || (local_43c <= fVar68)) || (local_43c <= fVar71)) {
                                    if ((uint)local_3d0 < 0x7fffffff) {
                                      local_348 = ZEXT416((uint)fVar63);
                                      local_3e8 = ZEXT416((uint)fVar72);
                                      local_328 = CONCAT44(local_328._4_4_,fVar69);
                                      uVar47 = 0;
                                      do {
                                        fVar67 = (float)(int)uVar47;
                                        uVar26 = uVar47 + 1;
                                        fVar68 = (float)(int)uVar26;
                                        fVar60 = (fVar67 - fVar63) / fVar69 + fVar62;
                                        fVar69 = (fVar68 - fVar63) / fVar69 + fVar62;
                                        in_stack_fffffffffffffb98.data._0_4_ = fVar60;
                                        local_438._0_4_ = fVar67;
                                        if ((fVar67 <= fVar63) || (fVar72 <= fVar68)) {
                                          if ((fVar72 < fVar67) && (fVar68 < fVar63)) {
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar47,e,fVar63,fVar62,
                                                       fVar68,fVar69);
                                            fVar63 = fVar68;
                                            fVar60 = in_stack_fffffffffffffb98.data._0_4_;
                                            fVar62 = fVar69;
                                            fVar67 = (float)local_438._0_4_;
LAB_001ae51f:
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar47,e,fVar63,fVar62,
                                                       fVar67,fVar60);
                                            fVar69 = in_stack_fffffffffffffb98.data._0_4_;
                                            fVar63 = (float)local_438._0_4_;
                                            goto LAB_001ae538;
                                          }
                                          if (((fVar63 < fVar67) && (fVar67 < fVar72)) ||
                                             ((fVar72 < fVar67 && (fVar67 < fVar63))))
                                          goto LAB_001ae51f;
                                          if (((fVar63 < fVar68) && (fVar68 < fVar72)) ||
                                             ((fVar72 < fVar68 && (fVar68 < fVar63))))
                                          goto LAB_001ae491;
                                        }
                                        else {
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar47,e,fVar63,fVar62,fVar67
                                                     ,fVar60);
                                          fVar62 = in_stack_fffffffffffffb98.data._0_4_;
                                          fVar63 = (float)local_438._0_4_;
LAB_001ae491:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar47,e,fVar63,fVar62,fVar68
                                                     ,fVar69);
                                          fVar63 = fVar68;
LAB_001ae538:
                                          fVar62 = fVar69;
                                          fVar72 = (float)local_3e8._0_4_;
                                        }
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar47,e,fVar63,fVar62,fVar72,
                                                   fVar61);
                                        fVar62 = (float)local_448;
                                        fVar69 = (float)local_328;
                                        fVar63 = (float)local_348._0_4_;
                                        fVar72 = (float)local_3e8._0_4_;
                                        uVar47 = uVar26;
                                      } while (uVar24 != uVar26);
                                    }
                                  }
                                  else {
                                    if (fVar67 <= fVar62) {
                                      fVar67 = fVar62;
                                    }
                                    uVar47 = (uint)fVar68;
                                    if (fVar61 <= fVar60) {
                                      fVar60 = fVar61;
                                    }
                                    if (uVar47 == (int)fVar71) {
                                      if (((int)uVar47 < 0) || ((int)uVar24 <= (int)uVar47)) {
                                        __assert_fail("x >= 0 && x < len",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xbc2,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar35 = (ulong)uVar47;
                                      *(float *)((long)&scanline->data + uVar35 * 4) =
                                           (((fVar71 - (float)(int)uVar47) +
                                            (fVar68 - (float)(int)uVar47)) * -0.5 + 1.0) *
                                           e->direction * (fVar60 - fVar67) +
                                           *(float *)((long)&scanline->data + uVar35 * 4);
                                      fVar63 = (fVar60 - fVar67) * e->direction;
                                    }
                                    else {
                                      fVar69 = e->fdy;
                                      fVar70 = fVar71;
                                      if (fVar71 < fVar68) {
                                        fVar63 = fVar62 - fVar67;
                                        fVar67 = (fVar62 - fVar60) + fVar61;
                                        fVar69 = -fVar69;
                                        fVar60 = fVar63 + fVar61;
                                        fVar70 = fVar68;
                                        fVar63 = fVar72;
                                        fVar68 = fVar71;
                                      }
                                      iVar25 = (int)fVar70;
                                      iVar43 = (int)fVar68 + 1;
                                      fVar71 = ((float)iVar43 - fVar63) * fVar69 + fVar62;
                                      fVar63 = e->direction;
                                      fVar72 = (fVar71 - fVar67) * fVar63;
                                      lVar27 = (long)(int)fVar68;
                                      *(float *)((long)&scanline->data + lVar27 * 4) =
                                           (((fVar68 - (float)(int)fVar68) + 1.0) * -0.5 + 1.0) *
                                           fVar72 + *(float *)((long)&scanline->data + lVar27 * 4);
                                      if (iVar25 - iVar43 != 0 && iVar43 <= iVar25) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar27 * 4 + 4) =
                                               fVar69 * fVar63 * 0.5 + fVar72 +
                                               *(float *)((long)&scanline->data + lVar27 * 4 + 4);
                                          fVar72 = fVar72 + fVar69 * fVar63;
                                          lVar27 = lVar27 + 1;
                                        } while (iVar25 + -1 != (int)lVar27);
                                      }
                                      if (1.01 < ABS(fVar72)) {
                                        __assert_fail("ImFabs(area) <= 1.01f",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xbe7,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar35 = (ulong)iVar25;
                                      *(float *)((long)&scanline->data + uVar35 * 4) =
                                           (fVar60 - (fVar69 * (float)(iVar25 - iVar43) + fVar71)) *
                                           (((fVar70 - (float)iVar25) + 0.0) * -0.5 + 1.0) * fVar63
                                           + fVar72 + *(float *)((long)&scanline->data + uVar35 * 4)
                                      ;
                                      fVar63 = (fVar60 - fVar67) * fVar63;
                                    }
                                    local_2d0[uVar35] = fVar63 + local_2d0[uVar35];
                                  }
                                }
                                else if (fVar63 < local_43c) {
                                  if (0.0 <= fVar63) {
                                    local_348 = ZEXT416((uint)fVar63);
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,(int)fVar63,e,fVar63,fVar62,fVar63,
                                               fVar61);
                                    iVar43 = (int)fVar63 + 1;
                                    fVar63 = (float)local_348._0_4_;
                                    fVar62 = (float)local_448;
                                  }
                                  else {
                                    iVar43 = 0;
                                  }
                                  stbtt__handle_clipped_edge
                                            (local_368,iVar43,e,fVar63,fVar62,fVar63,fVar61);
                                  fVar62 = (float)local_448;
                                }
                              }
                              if ((uint)local_3d0 < 0x7fffffff) {
                                fVar61 = 0.0;
                                psVar34 = scanline;
                                uVar35 = local_3d8;
                                lVar27 = local_260;
                                do {
                                  fVar61 = fVar61 + *(float *)((long)&psVar34->data + local_260 * 4)
                                  ;
                                  iVar43 = (int)(ABS(*(float *)&psVar34->data + fVar61) * 255.0 +
                                                0.5);
                                  uVar45 = (uchar)iVar43;
                                  if (0xfe < iVar43) {
                                    uVar45 = 0xff;
                                  }
                                  local_2d8[(int)uVar35] = uVar45;
                                  uVar35 = (ulong)((int)uVar35 + 1);
                                  psVar34 = (stbtt__buf *)((long)&psVar34->data + 4);
                                  lVar27 = lVar27 + -1;
                                } while (lVar27 != 0);
                              }
                              for (puVar30 = local_3c8.data; puVar30 != (uchar *)0x0;
                                  puVar30 = *(uchar **)puVar30) {
                                *(float *)(puVar30 + 8) =
                                     *(float *)(puVar30 + 0xc) + *(float *)(puVar30 + 8);
                              }
                              sVar23 = local_3ec + 1;
                              uVar35 = (ulong)((uint)local_248 + 1);
                              local_3d8 = (ulong)(uint)((int)local_3d8 + (int)local_2e0);
                              pvVar29 = local_420;
                              lVar27 = local_378;
                              puVar48 = local_370;
                            } while ((uint)local_248 != local_34c);
                          }
                          else {
                            local_370 = (undefined8 *)0x0;
                            pvVar29 = local_420;
                            lVar27 = local_378;
                            puVar48 = local_370;
                          }
                          while (local_420 = pvVar29, local_378 = lVar27,
                                puVar48 != (undefined8 *)0x0) {
                            puVar33 = (undefined8 *)*puVar48;
                            ImGui::MemFree(puVar48);
                            pvVar29 = local_420;
                            lVar27 = local_378;
                            puVar48 = puVar33;
                          }
                          if (scanline != local_238) {
                            ImGui::MemFree(scanline);
                          }
                          ImGui::MemFree(local_360);
                        }
                        ImGui::MemFree(pvVar29);
                        ImGui::MemFree(local_410);
                      }
                    }
                  }
                  ImGui::MemFree((void *)CONCAT44(local_3f8._4_4_,(stbtt_uint32)local_3f8));
                  uVar24 = local_3b8.h_oversample;
                  uVar35 = local_3b8._32_8_ & 0xffffffff;
                  lVar38 = lVar27;
                  if (1 < uVar35) {
                    in_stack_fffffffffffffb98.data = (uchar *)(long)local_3b8.stride_in_bytes;
                    uVar16 = *(ushort *)(lVar27 + 4);
                    local_238[0].data = (uchar *)0x0;
                    uVar47 = CONCAT22(0,*(ushort *)(lVar27 + 6));
                    local_438._0_4_ = uVar47;
                    lVar38 = local_378;
                    if (uVar47 != 0) {
                      puVar30 = local_3b8.pixels +
                                (ulong)*(ushort *)(lVar27 + 10) * (long)local_3b8.stride_in_bytes +
                                (ulong)*(ushort *)(lVar27 + 8);
                      iVar43 = uVar16 - local_3b8.h_oversample;
                      uVar31 = (ulong)(iVar43 + 1);
                      iVar25 = 0;
                      do {
                        memset(local_238,0,uVar35);
                        switch(uVar24) {
                        case 2:
                          if (iVar43 < 0) {
LAB_001aeb0b:
                            uVar49 = 0;
                            uVar47 = 0;
                          }
                          else {
                            uVar49 = 0;
                            uVar47 = 0;
                            do {
                              bVar3 = puVar30[uVar49];
                              bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 & 7)
                                               );
                              *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 + 2 & 7)) =
                                   bVar3;
                              uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                              puVar30[uVar49] = (uchar)(uVar47 >> 1);
                              uVar49 = uVar49 + 1;
                            } while (uVar31 != uVar49);
                          }
                          break;
                        case 3:
                          if (iVar43 < 0) goto LAB_001aeb0b;
                          uVar49 = 0;
                          uVar47 = 0;
                          do {
                            bVar3 = puVar30[uVar49];
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 + 3 & 7)) =
                                 bVar3;
                            uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                            puVar30[uVar49] = (uchar)(uVar47 / 3);
                            uVar49 = uVar49 + 1;
                          } while (uVar31 != uVar49);
                          break;
                        case 4:
                          if (iVar43 < 0) goto LAB_001aeb0b;
                          uVar49 = 0;
                          uVar47 = 0;
                          do {
                            bVar3 = puVar30[uVar49];
                            uVar42 = (ulong)((uint)uVar49 & 7);
                            bVar4 = *(byte *)((long)&local_238[0].data + uVar42);
                            *(byte *)((long)&local_238[0].data + (uVar42 ^ 4)) = bVar3;
                            uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                            puVar30[uVar49] = (uchar)(uVar47 >> 2);
                            uVar49 = uVar49 + 1;
                          } while (uVar31 != uVar49);
                          break;
                        case 5:
                          if (iVar43 < 0) goto LAB_001aeb0b;
                          uVar49 = 0;
                          uVar47 = 0;
                          do {
                            bVar3 = puVar30[uVar49];
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 + 5 & 7)) =
                                 bVar3;
                            uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                            puVar30[uVar49] = (uchar)(uVar47 / 5);
                            uVar49 = uVar49 + 1;
                          } while (uVar31 != uVar49);
                          break;
                        default:
                          if (iVar43 < 0) goto LAB_001aeb0b;
                          uVar49 = 0;
                          uVar47 = 0;
                          do {
                            bVar3 = puVar30[uVar49];
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)(uVar24 + (uint)uVar49 & 7))
                                 = bVar3;
                            uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                            puVar30[uVar49] = (uchar)(uVar47 / uVar24);
                            uVar49 = uVar49 + 1;
                          } while (uVar31 != uVar49);
                        }
                        if ((int)uVar49 < (int)(uint)uVar16) {
                          uVar49 = uVar49 & 0xffffffff;
                          do {
                            if (puVar30[uVar49] != '\0') {
                              __assert_fail("pixels[i] == 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                            ,0xf21,
                                            "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar47 = uVar47 - *(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)uVar49 & 7));
                            puVar30[uVar49] = (uchar)(uVar47 / uVar24);
                            uVar49 = uVar49 + 1;
                          } while ((int)uVar49 < (int)(uint)uVar16);
                        }
                        puVar30 = puVar30 + (long)in_stack_fffffffffffffb98.data;
                        iVar25 = iVar25 + 1;
                        lVar38 = local_378;
                      } while (iVar25 != local_438._0_4_);
                    }
                  }
                  uVar24 = local_3b8.v_oversample;
                  uVar35 = (ulong)local_3b8.v_oversample;
                  lVar27 = lVar38;
                  if (1 < uVar35) {
                    lVar40 = (long)local_3b8.stride_in_bytes;
                    in_stack_fffffffffffffb98.data._0_4_ = (float)(uint)*(ushort *)(lVar38 + 6);
                    local_238[0].data = (uchar *)0x0;
                    uVar47 = CONCAT22(0,*(ushort *)(lVar38 + 4));
                    local_438._0_4_ = uVar47;
                    lVar27 = local_378;
                    if (uVar47 != 0) {
                      pbVar58 = local_3b8.pixels +
                                (ulong)*(ushort *)(lVar38 + 10) * lVar40 +
                                (ulong)*(ushort *)(lVar38 + 8);
                      iVar43 = *(ushort *)(lVar38 + 6) - local_3b8.v_oversample;
                      uVar31 = (ulong)(iVar43 + 1);
                      iVar25 = 0;
                      do {
                        memset(local_238,0,uVar35);
                        switch(uVar24) {
                        case 2:
                          if (iVar43 < 0) {
LAB_001aed84:
                            uVar49 = 0;
                            uVar47 = 0;
                          }
                          else {
                            uVar49 = 0;
                            uVar47 = 0;
                            pbVar53 = pbVar58;
                            do {
                              bVar3 = *pbVar53;
                              bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 & 7)
                                               );
                              *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 + 2 & 7)) =
                                   bVar3;
                              uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                              *pbVar53 = (byte)(uVar47 >> 1);
                              uVar49 = uVar49 + 1;
                              pbVar53 = pbVar53 + lVar40;
                            } while (uVar31 != uVar49);
                          }
                          break;
                        case 3:
                          if (iVar43 < 0) goto LAB_001aed84;
                          uVar49 = 0;
                          uVar47 = 0;
                          pbVar53 = pbVar58;
                          do {
                            bVar3 = *pbVar53;
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 + 3 & 7)) =
                                 bVar3;
                            uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                            *pbVar53 = (byte)(uVar47 / 3);
                            uVar49 = uVar49 + 1;
                            pbVar53 = pbVar53 + lVar40;
                          } while (uVar31 != uVar49);
                          break;
                        case 4:
                          if (iVar43 < 0) goto LAB_001aed84;
                          uVar49 = 0;
                          uVar47 = 0;
                          pbVar53 = pbVar58;
                          do {
                            bVar3 = *pbVar53;
                            uVar42 = (ulong)((uint)uVar49 & 7);
                            bVar4 = *(byte *)((long)&local_238[0].data + uVar42);
                            *(byte *)((long)&local_238[0].data + (uVar42 ^ 4)) = bVar3;
                            uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                            *pbVar53 = (byte)(uVar47 >> 2);
                            uVar49 = uVar49 + 1;
                            pbVar53 = pbVar53 + lVar40;
                          } while (uVar31 != uVar49);
                          break;
                        case 5:
                          if (iVar43 < 0) goto LAB_001aed84;
                          uVar49 = 0;
                          uVar47 = 0;
                          pbVar53 = pbVar58;
                          do {
                            bVar3 = *pbVar53;
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 + 5 & 7)) =
                                 bVar3;
                            uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                            *pbVar53 = (byte)(uVar47 / 5);
                            uVar49 = uVar49 + 1;
                            pbVar53 = pbVar53 + lVar40;
                          } while (uVar31 != uVar49);
                          break;
                        default:
                          if (iVar43 < 0) goto LAB_001aed84;
                          uVar49 = 0;
                          uVar47 = 0;
                          pbVar53 = pbVar58;
                          do {
                            bVar3 = *pbVar53;
                            bVar4 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar49 & 7));
                            *(byte *)((long)&local_238[0].data + (ulong)(uVar24 + (uint)uVar49 & 7))
                                 = bVar3;
                            uVar47 = uVar47 + ((uint)bVar3 - (uint)bVar4);
                            *pbVar53 = (byte)(uVar47 / uVar24);
                            uVar49 = uVar49 + 1;
                            pbVar53 = pbVar53 + lVar40;
                          } while (uVar31 != uVar49);
                        }
                        iVar55 = (int)uVar49;
                        iVar50 = (int)in_stack_fffffffffffffb98.data - iVar55;
                        if (iVar50 != 0 && iVar55 <= (int)in_stack_fffffffffffffb98.data) {
                          lVar27 = (long)iVar55;
                          pbVar53 = pbVar58 + lVar40 * lVar27;
                          do {
                            if (*pbVar53 != 0) {
                              __assert_fail("pixels[i*stride_in_bytes] == 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                            ,0xf5f,
                                            "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar47 = uVar47 - *(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)lVar27 & 7));
                            *pbVar53 = (byte)(uVar47 / uVar24);
                            lVar27 = lVar27 + 1;
                            pbVar53 = pbVar53 + lVar40;
                            iVar50 = iVar50 + -1;
                          } while (iVar50 != 0);
                        }
                        pbVar58 = pbVar58 + 1;
                        iVar25 = iVar25 + 1;
                        lVar27 = local_378;
                      } while (iVar25 != local_438._0_4_);
                    }
                  }
                  sVar17 = (short)*(undefined4 *)(lVar27 + 8);
                  *local_278 = sVar17;
                  sVar6 = *(short *)(lVar27 + 10);
                  local_278[1] = sVar6;
                  uVar16 = *(ushort *)(lVar27 + 4);
                  local_278[2] = sVar17 + uVar16;
                  uVar5 = *(ushort *)(lVar27 + 6);
                  local_278[3] = sVar6 + uVar5;
                  *(float *)(local_278 + 8) =
                       (float)(int)(short)((short)(local_308 << 8) + (short)local_30c) * local_2c8;
                  *(float *)(local_278 + 4) = (float)(int)local_418 * local_310 + local_354;
                  *(float *)(local_278 + 6) = (float)local_304 * local_314 + local_350;
                  *(float *)(local_278 + 10) =
                       (float)(int)(local_418 + uVar16) * local_310 + local_354;
                  *(float *)(local_278 + 0xc) =
                       (float)(int)(local_304 + (uint)uVar5) * local_314 + local_350;
                  lVar41 = local_270;
                  lVar40 = local_280;
                  lVar27 = local_288;
                  lVar38 = local_268;
                  fVar61 = local_354;
                }
                lVar38 = lVar38 + 1;
                lVar41 = lVar41 + 1;
              } while (lVar41 < *(int *)(lVar40 + 0x10));
            }
            lVar40 = local_290 + 1;
          } while (lVar40 != local_298);
        }
        local_3b8.v_oversample = local_31c;
        local_3b8.h_oversample = local_318;
        fVar61 = *(float *)(local_2a8->Name + local_2b0 + -4);
        if ((fVar61 != 1.0) || (NAN(fVar61))) {
          lVar27 = 0;
          do {
            lVar38 = (long)((float)(int)lVar27 * fVar61);
            if (0xfe < (uint)lVar38) {
              lVar38 = 0xff;
            }
            *(char *)((long)&local_238[0].data + lVar27) = (char)lVar38;
            lVar27 = lVar27 + 1;
          } while (lVar27 != 0x100);
          if (*(int *)&local_400[1].data != 0) {
            pvVar29 = local_400[1].userdata;
            do {
              if ((*(int *)((long)pvVar29 + 0xc) != 0) && (*(ushort *)((long)pvVar29 + 6) != 0)) {
                uVar16 = *(ushort *)((long)pvVar29 + 4);
                puVar30 = local_3b8.pixels +
                          (ulong)*(ushort *)((long)pvVar29 + 10) * (long)local_3b8.stride_in_bytes +
                          (ulong)*(ushort *)((long)pvVar29 + 8);
                uVar24 = (uint)*(ushort *)((long)pvVar29 + 6);
                do {
                  if ((ulong)uVar16 != 0) {
                    uVar35 = 0;
                    do {
                      puVar30[uVar35] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar30[uVar35]);
                      uVar35 = uVar35 + 1;
                    } while (uVar16 != uVar35);
                  }
                  puVar30 = puVar30 + local_3b8.stride_in_bytes;
                  bVar11 = 1 < (int)uVar24;
                  uVar24 = uVar24 - 1;
                } while (bVar11);
              }
              pvVar29 = (void *)((long)pvVar29 + 0x10);
            } while (pvVar29 !=
                     (void *)((long)*(int *)&local_400[1].data * 0x10 + (long)local_400[1].userdata)
                    );
          }
        }
        local_400[1].userdata = (void *)0x0;
        lVar27 = local_2a0 + 1;
      } while (lVar27 < (atlas->ConfigData).Size);
    }
    ImGui::MemFree(local_3b8.nodes);
    ImGui::MemFree(local_3b8.pack_info);
    ImGui::MemFree(local_2f8);
    if (0 < (atlas->ConfigData).Size) {
      lVar27 = 0;
      pIVar74 = atlas;
      do {
        pIVar28 = (atlas->ConfigData).Data;
        pIVar7 = pIVar28[lVar27].DstFont;
        if (pIVar28[lVar27].MergeMode == true) {
          atlas = pIVar74;
          ImFont::BuildLookupTable(pIVar7);
          pIVar74 = atlas;
        }
        pIVar28 = pIVar28 + lVar27;
        pvVar29 = (void *)(lVar27 * 0xc0 + (long)local_408);
        if (pIVar28->MergeMode == false) {
          lVar38 = *(long *)((long)pvVar29 + 8);
          lVar40 = (long)*(int *)((long)pvVar29 + 0x24);
          uVar24 = (int)(short)((ushort)*(byte *)(lVar38 + 6 + lVar40) << 8) |
                   (uint)*(byte *)(lVar38 + 7 + lVar40);
          fVar61 = -1.0;
          if (0 < (short)uVar24) {
            fVar61 = 1.0;
          }
          uVar47 = (int)(short)((ushort)*(byte *)(lVar38 + 4 + lVar40) << 8) |
                   (uint)*(byte *)(lVar38 + 5 + lVar40);
          fVar60 = -1.0;
          if (0 < (short)uVar47) {
            fVar60 = 1.0;
          }
          fVar62 = pIVar28->SizePixels / (float)(int)(uVar47 - uVar24);
          in_stack_fffffffffffffb98 =
               (stbtt__buf)ZEXT416((uint)(float)(int)((float)(int)uVar24 * fVar62 + fVar61));
          local_438 = ZEXT416((uint)(float)(int)(fVar62 * (float)(int)uVar47 + fVar60));
          atlas = pIVar74;
          ImFont::ClearOutputData(pIVar7);
          pIVar7->FontSize = pIVar28->SizePixels;
          pIVar7->ConfigData = pIVar28;
          pIVar7->ContainerAtlas = atlas;
          pIVar7->Ascent = (float)local_438._0_4_;
          pIVar7->Descent = in_stack_fffffffffffffb98.data._0_4_;
          pIVar74 = atlas;
        }
        pIVar7->ConfigDataCount = pIVar7->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvVar29 + 0xb8)) {
          in_stack_fffffffffffffb98.data._0_4_ = (pIVar28->GlyphOffset).x;
          local_438 = ZEXT416((uint)((float)(int)(pIVar7->Ascent + 0.5) + (pIVar28->GlyphOffset).y))
          ;
          lVar38 = 0;
          do {
            if (0 < *(int *)(*(long *)((long)pvVar29 + 0xb0) + 0x10 + lVar38 * 0x28)) {
              lVar40 = *(long *)((long)pvVar29 + 0xb0) + lVar38 * 0x28;
              lVar59 = 0;
              lVar41 = 0;
              do {
                lVar10 = *(long *)(lVar40 + 0x18);
                if ((((*(short *)(lVar10 + lVar59) != 0) || (*(short *)(lVar10 + 4 + lVar59) != 0))
                    || (*(short *)(lVar10 + 2 + lVar59) != 0)) ||
                   (*(short *)(lVar10 + 6 + lVar59) != 0)) {
                  if (((pIVar28->MergeMode != true) ||
                      (uVar35 = lVar41 + (ulong)*(uint *)(lVar40 + 4),
                      (pIVar7->IndexLookup).Size <= (int)((uint)uVar35 & 0xffff))) ||
                     (((pIVar7->IndexLookup).Data[uVar35 & 0xffff] == 0xffff ||
                      ((pIVar7->Glyphs).Data == (ImFontGlyph *)0x0)))) {
                    fVar60 = 1.0 / (float)atlas->TexHeight;
                    fVar61 = 1.0 / (float)atlas->TexWidth;
                    atlas = pIVar74;
                    ImFont::AddGlyph(pIVar7,(short)*(uint *)(lVar40 + 4) + (short)lVar41,
                                     *(float *)(lVar10 + 8 + lVar59) + 0.0 +
                                     in_stack_fffffffffffffb98.data._0_4_,
                                     *(float *)(lVar10 + 0xc + lVar59) + 0.0 +
                                     (float)local_438._0_4_,
                                     *(float *)(lVar10 + 0x14 + lVar59) + 0.0 +
                                     in_stack_fffffffffffffb98.data._0_4_,
                                     *(float *)(lVar10 + 0x18 + lVar59) + 0.0 +
                                     (float)local_438._0_4_,
                                     (float)*(ushort *)(lVar10 + lVar59) * fVar61,
                                     (float)*(ushort *)(lVar10 + 2 + lVar59) * fVar60,
                                     (float)*(ushort *)(lVar10 + 4 + lVar59) * fVar61,
                                     (float)*(ushort *)(lVar10 + 6 + lVar59) * fVar60,
                                     *(float *)(lVar10 + 0x10 + lVar59));
                    pIVar74 = atlas;
                  }
                }
                lVar41 = lVar41 + 1;
                lVar59 = lVar59 + 0x1c;
              } while (lVar41 < *(int *)(lVar40 + 0x10));
            }
            lVar38 = lVar38 + 1;
          } while (lVar38 < *(int *)((long)pvVar29 + 0xb8));
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < (atlas->ConfigData).Size);
    }
    ImGui::MemFree(local_300);
    ImGui::MemFree(local_2f0);
    ImGui::MemFree(local_408);
    ImFontAtlasBuildFinish(atlas);
  }
  return SUB41(local_320,0);
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    atlas->TexID = NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Count glyphs/ranges
    int total_glyphs_count = 0;
    int total_ranges_count = 0;
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = atlas->GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, total_ranges_count++)
            total_glyphs_count += (in_range[1] - in_range[0]) + 1;
    }

    // We need a width for the skyline algorithm. Using a dumb heuristic here to decide of width. User can override TexDesiredWidth and TexGlyphPadding if they wish.
    // Width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    atlas->TexWidth = (atlas->TexDesiredWidth > 0) ? atlas->TexDesiredWidth : (total_glyphs_count > 4000) ? 4096 : (total_glyphs_count > 2000) ? 2048 : (total_glyphs_count > 1000) ? 1024 : 512;
    atlas->TexHeight = 0;

    // Start packing
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc = {};
    if (!stbtt_PackBegin(&spc, NULL, atlas->TexWidth, max_tex_height, 0, atlas->TexGlyphPadding, NULL))
        return false;
    stbtt_PackSetOversampling(&spc, 1, 1);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // Initialize font information (so we can error without any cleanup)
    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        int                 RectsCount;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)atlas->ConfigData.Size * sizeof(ImFontTempBuildData));
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            atlas->TexWidth = atlas->TexHeight = 0; // Reset output on failure
            ImGui::MemFree(tmp_array);
            return false;
        }
    }

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_ranges_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyphs_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyphs_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_ranges_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int font_glyphs_count = 0;
        int font_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, font_ranges_count++)
            font_glyphs_count += (in_range[1] - in_range[0]) + 1;
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = font_ranges_count;
        buf_ranges_n += font_ranges_count;
        for (int i = 0; i < font_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Gather the sizes of all rectangle we need
        tmp.Rects = buf_rects + buf_rects_n;
        tmp.RectsCount = font_glyphs_count;
        buf_rects_n += font_glyphs_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        IM_ASSERT(n == font_glyphs_count);

        // Detect missing glyphs and replace them with a zero-sized box instead of relying on the default glyphs
        // This allows us merging overlapping icon fonts more easily.
        int rect_i = 0;
        for (int range_i = 0; range_i < tmp.RangesCount; range_i++)
            for (int char_i = 0; char_i < tmp.Ranges[range_i].num_chars; char_i++, rect_i++)
                if (stbtt_FindGlyphIndex(&tmp.FontInfo, tmp.Ranges[range_i].first_unicode_codepoint_in_range + char_i) == 0)
                    tmp.Rects[rect_i].w = tmp.Rects[rect_i].h = 0;

        // Pack
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        // Also mark missing glyphs as non-packed so we don't attempt to render into them
        for (int i = 0; i < n; i++)
        {
            if (tmp.Rects[i].w == 0 && tmp.Rects[i].h == 0)
                tmp.Rects[i].was_packed = 0;
            if (tmp.Rects[i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
        }
    }
    IM_ASSERT(buf_rects_n == total_glyphs_count);
    IM_ASSERT(buf_packedchars_n == total_glyphs_count);
    IM_ASSERT(buf_ranges_n == total_ranges_count);

    // Create texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // Second pass: render font characters
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            for (const stbrp_rect* r = tmp.Rects; r != tmp.Rects + tmp.RectsCount; r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, spc.pixels, r->x, r->y, r->w, r->h, spc.stride_in_bytes);
        }
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)
        if (cfg.MergeMode)
            dst_font->BuildLookupTable();

        const float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float off_x = cfg.GlyphOffset.x;
        const float off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyphNoFallback((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, atlas->TexWidth, atlas->TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);
                dst_font->AddGlyph((ImWchar)codepoint, q.x0 + off_x, q.y0 + off_y, q.x1 + off_x, q.y1 + off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
            }
        }
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    ImFontAtlasBuildFinish(atlas);

    return true;
}